

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

SmallHeapBlockBitVector * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnsureFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool isCollecting)

{
  SmallHeapBlockBitVector *pSVar1;
  
  if (this->freeObjectList != this->lastFreeObjectHead) {
    pSVar1 = BuildFreeBitVector(this);
    return pSVar1;
  }
  CheckFreeBitVector(this,isCollecting);
  return &this->freeBits;
}

Assistant:

typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector *
SmallHeapBlockT<TBlockAttributes>::EnsureFreeBitVector(bool isCollecting)
{
    if (this->IsFreeBitsValid())
    {
        // the free object list hasn't change, so the free vector should be valid
        RECYCLER_SLOW_CHECK(CheckFreeBitVector(isCollecting));
        return this->GetFreeBitVector();
    }
    return BuildFreeBitVector();
}